

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O3

string * __thiscall
PyreNet::ActivationFactory::toString_abi_cxx11_
          (string *__return_storage_ptr__,ActivationFactory *this,activationType activation)

{
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  char *pcVar3;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "step";
    pcVar2 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "linear";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "sigmoid";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "tanh";
    pcVar2 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "relu";
    pcVar2 = "";
    break;
  default:
    puVar1 = (undefined8 *)
             __cxa_allocate_exception(8,this,CONCAT44(in_register_00000014,activation));
    *puVar1 = std::operator>>;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ActivationFactory::toString(LayerDefinition::activationType activation) {
        switch (activation) {
            case LayerDefinition::step: {
                return "step";
            }
            case LayerDefinition::linear: {
                return "linear";
            }
            case LayerDefinition::tanh: {
                return "tanh";
            }
            case LayerDefinition::sigmoid: {
                return "sigmoid";
            }
            case LayerDefinition::relu: {
                return "relu";
            }
            default: {
                throw std::exception();
            }
        }
    }